

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O1

void ztlex_sungetc(int c,ztlex_t *lex)

{
  if (c == 10) {
    lex->line = lex->line + -1;
    lex->column = lex->prevcolumn;
    lex->prevcolumn = -1;
  }
  else {
    lex->column = lex->column + -1;
  }
  lex->index = lex->index - 1;
  return;
}

Assistant:

static void ztlex_sungetc(int c, ztlex_t *lex)
{
  assert(lex->string);
  assert(lex->index >= 1);
  assert(lex->index <= lex->length);

  if (c == '\n')
  {
    assert(lex->line >= 0);
    lex->line--;
    assert(lex->prevcolumn >= 0);
    lex->column = lex->prevcolumn;
    lex->prevcolumn = -1; /* invalidate */
  }
  else
  {
    lex->column--;
  }

  lex->index--;

  assert(lex->string[lex->index] == c);
}